

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cc
# Opt level: O0

void __thiscall
gutil::Properties::getStringVector
          (Properties *this,char *key,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *value,char *defvalue,char sep)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  char in_R8B;
  char *in_stack_00000018;
  string *in_stack_00000020;
  char *in_stack_00000028;
  Properties *in_stack_00000030;
  size_t end;
  size_t start;
  string s;
  value_type *in_stack_ffffffffffffff48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff50;
  string local_88 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  undefined1 *local_50;
  string local_48 [39];
  char local_21;
  
  local_21 = in_R8B;
  std::__cxx11::string::string(local_48);
  getString(in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x11a6bb);
  local_50 = (undefined1 *)0x0;
  local_58 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)std::__cxx11::string::find((char)local_48,(ulong)(uint)(int)local_21);
  while (puVar1 = local_50, puVar2 = (undefined1 *)std::__cxx11::string::size(), puVar1 < puVar2) {
    std::__cxx11::string::substr((ulong)local_88,(ulong)local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::__cxx11::string::~string(local_88);
    local_50 = (undefined1 *)std::__cxx11::string::size();
    in_stack_ffffffffffffff50 = local_58;
    pvVar3 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)std::__cxx11::string::size();
    if (in_stack_ffffffffffffff50 < pvVar3) {
      local_50 = (undefined1 *)
                 ((long)&(local_58->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + 1);
      local_58 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)std::__cxx11::string::find((char)local_48,(ulong)(uint)(int)local_21);
    }
  }
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void Properties::getStringVector(const char *key, std::vector<std::string> &value,
                                 const char *defvalue, const char sep) const
{
  std::string s;
  size_t start, end;

  getString(key, s, defvalue);

  value.clear();

  start=0;
  end=s.find(sep);

  while (start < s.size())
  {
    value.push_back(s.substr(start, end-start));

    start=s.size();

    if (end < s.size())
    {
      start=end+1;
      end=s.find(sep, start);
    }
  }
}